

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void c2mir_finish(MIR_context_t ctx)

{
  c2m_ctx_t c2m_ctx_00;
  c2m_ctx_t *ppcVar1;
  c2m_ctx *c2m_ctx;
  c2m_ctx **c2m_ctx_ptr;
  MIR_context_t ctx_local;
  
  ppcVar1 = c2m_ctx_loc(ctx);
  c2m_ctx_00 = *ppcVar1;
  str_finish(c2m_ctx_00);
  reg_memory_finish(c2m_ctx_00);
  free(c2m_ctx_00);
  *ppcVar1 = (c2m_ctx_t)0x0;
  return;
}

Assistant:

void c2mir_finish (MIR_context_t ctx) {
  struct c2m_ctx **c2m_ctx_ptr = c2m_ctx_loc (ctx), *c2m_ctx = *c2m_ctx_ptr;

  str_finish (c2m_ctx);
  reg_memory_finish (c2m_ctx);
  free (c2m_ctx);
  *c2m_ctx_ptr = NULL;
}